

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_f.c
# Opt level: O2

void ffcprs(ParseData *lParse)

{
  int iVar1;
  iteratorCol *__ptr;
  DataInfo *__ptr_00;
  void *__ptr_01;
  Node *pNVar2;
  long lVar3;
  long lVar4;
  
  __ptr = lParse->colData;
  if (lParse->nCols < 1) {
    free(__ptr);
  }
  else {
    if (__ptr == (iteratorCol *)0x0) {
      printf("invalid free(lParse->colData) at %s:%d\n",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/support/cfitsio/cfitsio-4.6.2/eval_f.c"
             ,0x3bc);
    }
    else {
      free(__ptr);
    }
    lVar3 = 0;
    for (lVar4 = 0; __ptr_00 = lParse->varData, lVar4 < lParse->nCols; lVar4 = lVar4 + 1) {
      if (*(long *)((long)__ptr_00->naxes + lVar3 + 0x28) != 0) {
        if (*(int *)((long)__ptr_00->naxes + lVar3 + -0x14) == 0x106) {
          __ptr_01 = (void *)**(undefined8 **)((long)__ptr_00->naxes + lVar3 + 0x30);
          if (__ptr_01 == (void *)0x0) {
            printf("invalid free(((char**)lParse->varData[col].data)[0]) at %s:%d\n",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/support/cfitsio/cfitsio-4.6.2/eval_f.c"
                   ,0x3c0);
          }
          else {
            free(__ptr_01);
          }
        }
        free(*(void **)((long)lParse->varData->naxes + lVar3 + 0x28));
      }
      lVar3 = lVar3 + 0xa0;
    }
    if (__ptr_00 == (DataInfo *)0x0) {
      printf("invalid free(lParse->varData) at %s:%d\n",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/support/cfitsio/cfitsio-4.6.2/eval_f.c"
             ,0x3c3);
    }
    else {
      free(__ptr_00);
    }
    lParse->nCols = 0;
  }
  if (0 < (long)lParse->nNodes) {
    for (lVar3 = (long)lParse->nNodes * 0x180; lVar3 != 0; lVar3 = lVar3 + -0x180) {
      pNVar2 = lParse->Nodes;
      iVar1 = *(int *)((long)pNVar2[-1].SubNodes + lVar3 + -0x14);
      if (iVar1 == 0x409) {
        fits_free_region((SAORegion *)
                         pNVar2[*(int *)((long)pNVar2 + lVar3 + -0x16c)].value.data.dblptr);
      }
      else if (iVar1 == 0x408) {
        free(pNVar2[*(int *)((long)pNVar2 + lVar3 + -0x16c)].value.data.ptr);
      }
    }
    lParse->nNodes = 0;
  }
  free(lParse->Nodes);
  lParse->Nodes = (Node *)0x0;
  lParse->hdutype = -1;
  lParse->pixFilter = (PixelFilter *)0x0;
  lParse->nPrevDataRows = 0;
  lParse->nDataRows = 0;
  return;
}

Assistant:

void ffcprs( ParseData *lParse )
/*                                                                          */
/* Clear the parser, making it ready to accept a new expression.            */
/*--------------------------------------------------------------------------*/
{
   int col, node, i;

   if( lParse->nCols > 0 ) {
      FREE( lParse->colData  );
      for( col=0; col<lParse->nCols; col++ ) {
         if( lParse->varData[col].undef == NULL ) continue;
         if( lParse->varData[col].type  == BITSTR )
           FREE( ((char**)lParse->varData[col].data)[0] );
         free( lParse->varData[col].undef );
      }
      FREE( lParse->varData );
      lParse->nCols = 0;
   } else if ( lParse->colData ) {
     /* Special case if colData needed to be created with no columns */
     FREE( lParse->colData );
   }

   if( lParse->nNodes > 0 ) {
      node = lParse->nNodes;
      while( node-- ) {
         if( lParse->Nodes[node].operation==gtifilt_fct ) {
            i = lParse->Nodes[node].SubNodes[0];
            if (lParse->Nodes[ i ].value.data.ptr)
	        FREE( lParse->Nodes[ i ].value.data.ptr );
         }
         else if( lParse->Nodes[node].operation==regfilt_fct ) {
            i = lParse->Nodes[node].SubNodes[0];
            fits_free_region( (SAORegion *)lParse->Nodes[ i ].value.data.ptr );
         }
      }
      lParse->nNodes = 0;
   }
   if( lParse->Nodes ) free( lParse->Nodes );
   lParse->Nodes = NULL;

   lParse->hdutype = ANY_HDU;
   lParse->pixFilter = 0;
   lParse->nDataRows = lParse->nPrevDataRows = 0;
}